

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void store_message(int turn,char *msg)

{
  char *pcVar1;
  char *msg_local;
  int turn_local;
  
  if (*msg != '\0') {
    histpos = histpos + 1;
    if (histsize <= histpos) {
      histpos = 0;
    }
    msghistory[histpos].turn = turn;
    if (msghistory[histpos].msg != (char *)0x0) {
      free(msghistory[histpos].msg);
    }
    pcVar1 = strdup(msg);
    msghistory[histpos].msg = pcVar1;
  }
  return;
}

Assistant:

static void store_message(int turn, const char *msg)
{
    if (!*msg)
	return;
    
    histpos++;
    if (histpos >= histsize)
	histpos = 0;
    
    msghistory[histpos].turn = turn;
    if (msghistory[histpos].msg)
	free(msghistory[histpos].msg);
    msghistory[histpos].msg = strdup(msg);
}